

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void dictionary_dump(dictionary *d,FILE *out)

{
  char *pcVar1;
  long lVar2;
  
  if (out != (FILE *)0x0 && d != (dictionary *)0x0) {
    if (d->n < 1) {
      fwrite("empty dictionary\n",0x11,1,(FILE *)out);
      return;
    }
    for (lVar2 = 0; lVar2 < d->size; lVar2 = lVar2 + 1) {
      if (d->key[lVar2] != (char *)0x0) {
        pcVar1 = d->val[lVar2];
        if (pcVar1 == (char *)0x0) {
          pcVar1 = "UNDEF";
        }
        fprintf((FILE *)out,"%20s\t[%s]\n",d->key[lVar2],pcVar1);
      }
    }
  }
  return;
}

Assistant:

void dictionary_dump(const dictionary * d, FILE * out)
{
    ssize_t  i ;

    if (d == NULL || out == NULL) return ;
    if (d->n < 1) {
        fprintf(out, "empty dictionary\n");
        return ;
    }
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i]) {
            fprintf(out, "%20s\t[%s]\n",
                    d->key[i],
                    d->val[i] ? d->val[i] : "UNDEF");
        }
    }
    return ;
}